

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffs2c(char *instr,char *outstr,int *status)

{
  ulong local_40;
  size_t jj;
  size_t ii;
  size_t len;
  int *status_local;
  char *outstr_local;
  char *instr_local;
  
  if (*status < 1) {
    if (instr == (char *)0x0) {
      strcpy(outstr,"\'\'");
      instr_local._4_4_ = *status;
    }
    else {
      *outstr = '\'';
      ii = strlen(instr);
      if (0x44 < ii) {
        ii = 0x44;
      }
      local_40 = 1;
      for (jj = 0; jj < ii && local_40 < 0x45; jj = jj + 1) {
        outstr[local_40] = instr[jj];
        if (instr[jj] == '\'') {
          local_40 = local_40 + 1;
          outstr[local_40] = '\'';
        }
        local_40 = local_40 + 1;
      }
      for (; local_40 < 9; local_40 = local_40 + 1) {
        outstr[local_40] = ' ';
      }
      if (local_40 == 0x46) {
        outstr[0x45] = '\0';
      }
      else {
        outstr[local_40] = '\'';
        outstr[local_40 + 1] = '\0';
      }
      instr_local._4_4_ = *status;
    }
  }
  else {
    instr_local._4_4_ = *status;
  }
  return instr_local._4_4_;
}

Assistant:

int ffs2c(const char *instr, /* I - null terminated input string  */
          char *outstr,      /* O - null terminated quoted output string */
          int *status)       /* IO - error status */
/*
  convert an input string to a quoted string. Leading spaces 
  are significant.  FITS string keyword values must be at least 
  8 chars long so pad out string with spaces if necessary.
  (*** This 8 char requirement is now obsolete.  See ffs2c_nopad
  for an alternative ***)
      Example:   km/s ==> 'km/s    '
  Single quote characters in the input string will be replace by
  two single quote characters. e.g., o'brian ==> 'o''brian'
*/
{
    size_t len, ii, jj;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!instr)            /* a null input pointer?? */
    {
       strcpy(outstr, "''");   /* a null FITS string */
       return(*status);
    }

    outstr[0] = '\'';      /* start output string with a quote */

    len = strlen(instr);
    if (len > 68)
        len = 68;    /* limit input string to 68 chars */

    for (ii=0, jj=1; ii < len && jj < 69; ii++, jj++)
    {
        outstr[jj] = instr[ii];  /* copy each char from input to output */
        if (instr[ii] == '\'')
        {
            jj++;
            outstr[jj]='\'';   /* duplicate any apostrophies in the input */
        }
    }

    for (; jj < 9; jj++)       /* pad string so it is at least 8 chars long */
        outstr[jj] = ' ';

    if (jj == 70)   /* only occurs if the last char of string was a quote */
        outstr[69] = '\0';
    else
    {
        outstr[jj] = '\'';         /* append closing quote character */
        outstr[jj+1] = '\0';          /* terminate the string */
    }

    return(*status);
}